

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_145a60::DefaultErrStreamBuf::sync(DefaultErrStreamBuf *this)

{
  if (*(long *)&this->field_0x20 != *(long *)&this->field_0x28) {
    _GLOBAL__N_1::DefaultErrStreamBuf::sync();
  }
  return;
}

Assistant:

virtual int sync()
    {
        // Check if there is something into the write buffer
        if (pbase() != pptr())
        {
            // Print the contents of the write buffer into the standard error output
            std::size_t size = static_cast<int>(pptr() - pbase());
            fwrite(pbase(), 1, size, stderr);

            // Reset the pointer position to the beginning of the write buffer
            setp(pbase(), epptr());
        }

        return 0;
    }